

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_IteratorNext2(JSContext *ctx,JSValue enum_obj,JSValue method,int argc,JSValue *argv,
                        int *pdone)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  JSValueUnion JVar4;
  uint uVar5;
  ulong uVar6;
  ulong unaff_R15;
  JSValue JVar7;
  JSValue JVar8;
  JSValue this_obj;
  JSValueUnion local_58;
  undefined8 uStack_50;
  ulong local_40;
  JSValueUnion local_38;
  
  local_38 = method.u;
  uVar6 = enum_obj.tag;
  if ((int)method.tag == -1) {
    bVar2 = true;
    if ((*(short *)((long)local_38.ptr + 6) == 0xc) &&
       (*(char *)((long)local_38.ptr + 0x41) == '\f')) {
      if (argc == 0) {
        argv = (JSValue *)&local_58;
        local_58.float64 = local_58.float64 & 0xffffffff00000000;
        uStack_50 = 3;
      }
      local_40 = uVar6;
      JVar7 = (JSValue)(**(code **)((long)local_38.ptr + 0x38))
                                 (ctx,enum_obj.u.float64,uVar6,argc,argv,pdone,
                                  (int)*(short *)((long)local_38.ptr + 0x42));
      unaff_R15 = (ulong)JVar7.u.ptr >> 0x20;
      bVar2 = false;
      uVar6 = local_40;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar6;
      JVar7 = (JSValue)(auVar3 << 0x40);
    }
    if (!bVar2) goto LAB_0013c90b;
  }
  JVar4 = local_58;
  local_58.float64 = local_58.float64 & 0xffffffff00000000;
  uStack_50 = 3;
  JVar7.tag = 3;
  JVar7.u.float64 = JVar4.float64 & 0xffffffff00000000;
  this_obj.tag = uVar6;
  this_obj.u.float64 = enum_obj.u.float64;
  JVar7 = JS_CallInternal(ctx,method,this_obj,JVar7,argc,argv,2);
  local_58 = JVar7.u;
  uVar5 = (uint)JVar7.tag;
  if (uVar5 == 0xffffffff) {
    *pdone = 2;
    unaff_R15 = (ulong)local_58.ptr >> 0x20;
  }
  else {
    if (uVar5 != 6) {
      if ((0xfffffff4 < uVar5) &&
         (iVar1 = *local_58.ptr, *(int *)local_58.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar7);
      }
      JS_ThrowTypeError(ctx,"iterator must return an object");
    }
    *pdone = 0;
    JVar7 = (JSValue)(ZEXT816(6) << 0x40);
  }
LAB_0013c90b:
  JVar8.tag = JVar7.tag;
  JVar8.u.ptr = (void *)((ulong)JVar7.u._0_4_ | unaff_R15 << 0x20);
  return JVar8;
}

Assistant:

static JSValue JS_IteratorNext2(JSContext *ctx, JSValueConst enum_obj,
                                JSValueConst method,
                                int argc, JSValueConst *argv, int *pdone)
{
    JSValue obj;

    /* fast path for the built-in iterators (avoid creating the
       intermediate result object) */
    if (JS_IsObject(method)) {
        JSObject *p = JS_VALUE_GET_OBJ(method);
        if (p->class_id == JS_CLASS_C_FUNCTION &&
            p->u.cfunc.cproto == JS_CFUNC_iterator_next) {
            JSCFunctionType func;
            JSValueConst args[1];

            /* in case the function expects one argument */
            if (argc == 0) {
                args[0] = JS_UNDEFINED;
                argv = args;
            }
            func = p->u.cfunc.c_function;
            return func.iterator_next(ctx, enum_obj, argc, argv,
                                      pdone, p->u.cfunc.magic);
        }
    }
    obj = JS_Call(ctx, method, enum_obj, argc, argv);
    if (JS_IsException(obj))
        goto fail;
    if (!JS_IsObject(obj)) {
        JS_FreeValue(ctx, obj);
        JS_ThrowTypeError(ctx, "iterator must return an object");
        goto fail;
    }
    *pdone = 2;
    return obj;
 fail:
    *pdone = FALSE;
    return JS_EXCEPTION;
}